

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# db_iter.cc
# Opt level: O1

Slice __thiscall leveldb::anon_unknown_3::DBIter::value(DBIter *this)

{
  int iVar1;
  undefined4 extraout_var;
  size_type extraout_RDX;
  size_type sVar3;
  Slice SVar4;
  pointer pcVar2;
  
  if (this->valid_ != false) {
    if (this->direction_ == kForward) {
      iVar1 = (*this->iter_->_vptr_Iterator[9])();
      pcVar2 = (pointer)CONCAT44(extraout_var,iVar1);
      sVar3 = extraout_RDX;
    }
    else {
      pcVar2 = (this->saved_value_)._M_dataplus._M_p;
      sVar3 = (this->saved_value_)._M_string_length;
    }
    SVar4.size_ = sVar3;
    SVar4.data_ = pcVar2;
    return SVar4;
  }
  __assert_fail("valid_",
                "/workspace/llm4binary/github/license_all_cmakelists_25/walterzhaoJR[P]leveldb/db/db_iter.cc"
                ,0x45,"virtual Slice leveldb::(anonymous namespace)::DBIter::value() const");
}

Assistant:

Slice value() const override {
    assert(valid_);
    return (direction_ == kForward) ? iter_->value() : saved_value_;
  }